

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_copy_and_apply_volume_factor_s24
               (void *pSamplesOut,void *pSamplesIn,ma_uint64 sampleCount,float factor)

{
  long lVar1;
  int iVar2;
  
  if (sampleCount != 0 && (pSamplesIn != (void *)0x0 && pSamplesOut != (void *)0x0)) {
    lVar1 = 2;
    do {
      iVar2 = (int)((float)(int)((uint)*(byte *)((long)pSamplesIn + lVar1) << 0x18 |
                                (uint)*(byte *)((long)pSamplesIn + lVar1 + -1) << 0x10 |
                                (uint)*(byte *)((long)pSamplesIn + lVar1 + -2) << 8) * factor);
      *(char *)((long)pSamplesOut + lVar1 + -2) = (char)((uint)iVar2 >> 8);
      *(char *)((long)pSamplesOut + lVar1 + -1) = (char)((uint)iVar2 >> 0x10);
      *(char *)((long)pSamplesOut + lVar1) = (char)((uint)iVar2 >> 0x18);
      lVar1 = lVar1 + 3;
      sampleCount = sampleCount - 1;
    } while (sampleCount != 0);
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_factor_s24(void* pSamplesOut, const void* pSamplesIn, ma_uint64 sampleCount, float factor)
{
    ma_uint64 iSample;
    ma_uint8* pSamplesOut8;
    ma_uint8* pSamplesIn8;

    if (pSamplesOut == NULL || pSamplesIn == NULL) {
        return;
    }

    pSamplesOut8 = (ma_uint8*)pSamplesOut;
    pSamplesIn8  = (ma_uint8*)pSamplesIn;

    for (iSample = 0; iSample < sampleCount; iSample += 1) {
        ma_int32 sampleS32;

        sampleS32 = (ma_int32)(((ma_uint32)(pSamplesIn8[iSample*3+0]) << 8) | ((ma_uint32)(pSamplesIn8[iSample*3+1]) << 16) | ((ma_uint32)(pSamplesIn8[iSample*3+2])) << 24);
        sampleS32 = (ma_int32)(sampleS32 * factor);

        pSamplesOut8[iSample*3+0] = (ma_uint8)(((ma_uint32)sampleS32 & 0x0000FF00) >>  8);
        pSamplesOut8[iSample*3+1] = (ma_uint8)(((ma_uint32)sampleS32 & 0x00FF0000) >> 16);
        pSamplesOut8[iSample*3+2] = (ma_uint8)(((ma_uint32)sampleS32 & 0xFF000000) >> 24);
    }
}